

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDuctSegmentType::IfcDuctSegmentType(IfcDuctSegmentType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcDuctSegmentType";
  Schema_2x3::IfcFlowSegmentType::IfcFlowSegmentType
            (&this->super_IfcFlowSegmentType,&PTR_construction_vtable_24__0086f778);
  *(undefined8 *)&(this->super_IfcFlowSegmentType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x86f5f8;
  *(undefined8 *)&this->field_0x1e0 = 0x86f760;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x86f620;
  (this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x86f648;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x86f670;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x86f698;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x86f6c0;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x86f6e8;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x86f710;
  *(undefined8 *)&(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x86f738;
  *(undefined1 **)&(this->super_IfcFlowSegmentType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcDuctSegmentType() : Object("IfcDuctSegmentType") {}